

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# energy.c
# Opt level: O0

int32_t WebRtcSpl_Energy(int16_t *vector,size_t vector_length,int *scale_factor)

{
  int16_t iVar1;
  short *local_48;
  int16_t *vectorptr;
  size_t looptimes;
  ulong uStack_30;
  int scaling;
  size_t i;
  int32_t en;
  int *scale_factor_local;
  size_t vector_length_local;
  int16_t *vector_local;
  
  i._4_4_ = 0;
  iVar1 = WebRtcSpl_GetScalingSquare(vector,vector_length,vector_length);
  local_48 = vector;
  for (uStack_30 = 0; uStack_30 < vector_length; uStack_30 = uStack_30 + 1) {
    i._4_4_ = ((int)*local_48 * (int)*local_48 >> ((byte)iVar1 & 0x1f)) + i._4_4_;
    local_48 = local_48 + 1;
  }
  *scale_factor = (int)iVar1;
  return i._4_4_;
}

Assistant:

int32_t WebRtcSpl_Energy(int16_t* vector,
                         size_t vector_length,
                         int* scale_factor)
{
    int32_t en = 0;
    size_t i;
    int scaling =
        WebRtcSpl_GetScalingSquare(vector, vector_length, vector_length);
    size_t looptimes = vector_length;
    int16_t *vectorptr = vector;

    for (i = 0; i < looptimes; i++)
    {
      en += (*vectorptr * *vectorptr) >> scaling;
      vectorptr++;
    }
    *scale_factor = scaling;

    return en;
}